

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O3

vector<int,_std::allocator<int>_> *
phmap::priv::GenerateNumbersWithSeed
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,size_t n,int maxval,int seed)

{
  iterator __position;
  ulong uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  int value;
  flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_> unique_values;
  int local_94;
  vector<int,std::allocator<int>> *local_90;
  size_t local_88;
  size_t local_80;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  local_78;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.ctrl_ = EmptyGroup<std::is_same<std::allocator<int>,std::allocator<int>>>()::empty_group;
  local_78.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
       )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  local_78.slots_ = (slot_type *)0x0;
  local_78.size_ = 0;
  local_78.capacity_ = 0;
  local_90 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_80 = n;
  if (n != 0) {
    uVar4 = (ulong)(long)seed % 0x7fffffff + (ulong)((ulong)(long)seed % 0x7fffffff == 0);
    sVar3 = 0;
    do {
      do {
        local_88 = sVar3;
        uVar4 = (uVar4 * 0x41a7) % 0x7fffffff;
        uVar1 = (long)uVar4 % (long)(maxval + 1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1 & 0xffffffff;
        local_94 = (int)uVar1;
        raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
        ::emplace_decomposable<int,int_const&>
                  (&local_48,&local_78,&local_94,
                   SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
                   SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),&local_94);
        sVar3 = local_88;
      } while (local_48.second != true);
      __position._M_current = *(int **)(local_90 + 8);
      if (__position._M_current == *(int **)(local_90 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_90,__position,&local_94);
      }
      else {
        *__position._M_current = local_94;
        *(int **)(local_90 + 8) = __position._M_current + 1;
      }
      sVar3 = local_88 + 1;
    } while (local_88 + 1 != local_80);
  }
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::destroy_slots(&local_78);
  return (vector<int,_std::allocator<int>_> *)local_90;
}

Assistant:

inline std::vector<int> GenerateNumbersWithSeed(size_t n, int maxval, int seed) {
        // NOTE: Some tests rely on generated numbers not changing between test runs.
        // We use std::minstd_rand0 because it is well-defined, but don't use
        // std::uniform_int_distribution because platforms use different algorithms.
        std::minstd_rand0 rng(seed);

        std::vector<int> values;
        phmap::flat_hash_set<int> unique_values;
        if (values.size() < n) {
            for (size_t i = values.size(); i < n; i++) {
                int value;
                do {
                    value = static_cast<int>(rng()) % (maxval + 1);
                } while (!unique_values.insert(value).second);

                values.push_back(value);
            }
        }
        return values;
    }